

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::PrintSmartPointer<void,std::shared_ptr<void>>
               (shared_ptr<void> *ptr,ostream *os,char param_3)

{
  ostream *poVar1;
  
  if ((ptr->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr != (element_type *)0x0) {
    poVar1 = std::operator<<(os,"(");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    std::operator<<(poVar1,")");
    return;
  }
  std::operator<<(os,"(nullptr)");
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, char) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    // We can't print the value. Just print the pointer..
    *os << "(" << (VoidifyPointer)(ptr.get()) << ")";
  }
}